

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O3

void Cmd_testfade(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  FScriptPosition *sc;
  FString *pFVar2;
  FString cstr;
  FString colorstring;
  FString local_20;
  FString local_18;
  
  local_20.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 < 2) {
    Printf("testfade <color>\n");
  }
  else {
    sc = (FScriptPosition *)FCommandLine::operator[](argv,1);
    V_GetColorStringByName((char *)&local_18,sc);
    pFVar2 = FString::operator=(&local_20,&local_18);
    iVar1 = *(int *)(pFVar2->Chars + -0xc);
    FString::~FString(&local_18);
    cstr.Chars = local_20.Chars;
    if (iVar1 == 0) {
      cstr.Chars = FCommandLine::operator[](argv,1);
    }
    level.fadeto = V_GetColorFromString((DWORD *)0x0,cstr.Chars,(FScriptPosition *)0x0);
    FDynamicColormap::ChangeFade(&NormalLight,(PalEntry)level.fadeto);
  }
  FString::~FString(&local_20);
  return;
}

Assistant:

CCMD (testfade)
{
	FString colorstring;
	DWORD color;

	if (argv.argc() < 2)
	{
		Printf ("testfade <color>\n");
	}
	else
	{
		if ( !(colorstring = V_GetColorStringByName (argv[1])).IsEmpty() )
		{
			color = V_GetColorFromString (NULL, colorstring);
		}
		else
		{
			color = V_GetColorFromString (NULL, argv[1]);
		}
		level.fadeto = color;
		NormalLight.ChangeFade (color);
	}
}